

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall gmath::OrthoCamera::OrthoCamera(OrthoCamera *this,Properties *prop)

{
  bool bVar1;
  double dVar2;
  Vector3d T;
  string origin;
  
  Camera::Camera(&this->super_Camera,prop,-1);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_00173910;
  gutil::Properties::getValue<double>(prop,"resolution",&this->res,(char *)0x0);
  gutil::Properties::getValue<double>(prop,"depth.resolution",&this->dres,"1");
  bVar1 = gutil::Properties::contains(prop,"origin.T");
  if (bVar1) {
    SVector<double,_3>::SVector(&T);
    gutil::Properties::getValue<gmath::SVector<double,3>>(prop,"origin.T",&T,(char *)0x0);
    origin._M_dataplus._M_p = (pointer)&origin.field_2;
    origin._M_string_length = 0;
    origin.field_2._M_local_buf[0] = '\0';
    gutil::Properties::getValue<std::__cxx11::string>(prop,"origin",&origin,"corner");
    bVar1 = std::operator==(&origin,"center");
    if (bVar1) {
      dVar2 = this->res * 0.5;
      T.v[0] = T.v[0] - dVar2;
      T.v[1] = dVar2 + T.v[1];
    }
    SVector<double,_3>::operator=(&(this->super_Camera).T,&T);
    std::__cxx11::string::~string((string *)&origin);
  }
  return;
}

Assistant:

OrthoCamera::OrthoCamera(const gutil::Properties &prop)
  : Camera(prop, -1)
{
  prop.getValue("resolution", res);
  prop.getValue("depth.resolution", dres, "1");

  if (prop.contains("origin.T"))
  {
    Vector3d T;
    prop.getValue("origin.T", T);

    std::string origin;
    prop.getValue("origin", origin, "corner");

    if (origin == "center")
    {
      T[0]-=res/2;
      T[1]+=res/2;
    }

    setT(T);
  }
}